

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall
DataSet::DataSet(DataSet *this,Matrix<double> *matrix,uint beg_row,uint end_row,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels_local;
  uint end_row_local;
  uint beg_row_local;
  Matrix<double> *matrix_local;
  DataSet *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_labels);
  Matrix<double>::Matrix(&this->m_matrix);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_labels,labels);
  load(this,matrix,beg_row,end_row);
  return;
}

Assistant:

DataSet::DataSet(const Matrix_d& matrix, unsigned beg_row, unsigned end_row, const std::vector<std::string>& labels){
    m_labels=labels;
    load(matrix, beg_row, end_row);
}